

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.c
# Opt level: O0

_Bool check_parse_miniscript
                (char *function,char *descriptor,char *expected,char **key_name_list,
                char **key_value_list,size_t list_num,uint32_t flags)

{
  char *__s1;
  char **__s2;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  bool local_265;
  uint32_t index;
  _Bool is_success;
  char *pcStack_260;
  int ret;
  char *hex;
  uchar script [520];
  size_t local_48;
  size_t written;
  size_t list_num_local;
  char **key_value_list_local;
  char **key_name_list_local;
  char *expected_local;
  char *descriptor_local;
  char *function_local;
  
  local_48 = 0;
  pcStack_260 = (char *)0x0;
  written = list_num;
  list_num_local = (size_t)key_value_list;
  key_value_list_local = key_name_list;
  key_name_list_local = (char **)expected;
  expected_local = descriptor;
  descriptor_local = function;
  uVar1 = wally_descriptor_parse_miniscript
                    (descriptor,key_name_list,key_value_list,list_num,0,flags,(uchar *)&hex,0x208,
                     &local_48);
  if (uVar1 == 0) {
    uVar1 = wally_hex_from_bytes((uchar *)&hex,local_48,&stack0xfffffffffffffda0);
    __s2 = key_name_list_local;
    __s1 = pcStack_260;
    if (uVar1 == 0) {
      sVar3 = strlen(pcStack_260);
      iVar2 = strncmp(__s1,(char *)__s2,sVar3 + 1);
      if (iVar2 != 0) {
        printf("%s:\n  Input: %s\n  Output: %s\n  Expect: %s\n",descriptor_local,expected_local,
               pcStack_260,key_name_list_local);
      }
      local_265 = iVar2 == 0;
      wally_free_string(pcStack_260);
      function_local._7_1_ = local_265;
    }
    else {
      printf("wally_hex_from_bytes NG[%d]\n",(ulong)uVar1);
      function_local._7_1_ = false;
    }
  }
  else {
    printf("wally_descriptor_parse_miniscript NG[%d]\n",(ulong)uVar1);
    function_local._7_1_ = false;
  }
  return function_local._7_1_;
}

Assistant:

static bool check_parse_miniscript(const char *function, const char *descriptor,
                                   const char *expected,
                                   const char **key_name_list,
                                   const char **key_value_list, size_t list_num,
                                   uint32_t flags)
{
    size_t written = 0;
    unsigned char script[520];
    char *hex = NULL;
    int ret;
    bool is_success = false;
    uint32_t index = 0;

    ret = wally_descriptor_parse_miniscript(
        descriptor,
        key_name_list,
        key_value_list,
        list_num,
        index,
        flags,
        script,
        sizeof(script),
        &written);
    if (ret != WALLY_OK) {
        printf("wally_descriptor_parse_miniscript NG[%d]\n", ret);
        return false;
    }

    ret = wally_hex_from_bytes(script, written, &hex);
    if (ret != WALLY_OK) {
        printf("wally_hex_from_bytes NG[%d]\n", ret);
        return false;
    }

    if (strncmp(hex, expected, strlen(hex) + 1) == 0) {
        is_success = true;
    } else
        printf("%s:\n  Input: %s\n  Output: %s\n  Expect: %s\n",
               function, descriptor, hex, expected);

    wally_free_string(hex);
    return is_success;
}